

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

string * __thiscall
cmCTestVC::GetNightlyTime_abi_cxx11_(string *__return_storage_ptr__,cmCTestVC *this)

{
  cmCTest *this_00;
  tm *ptVar1;
  allocator<char> local_449;
  string local_448;
  char current_time [1024];
  
  this_00 = this->CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"NightlyStartTime",&local_449);
  cmCTest::GetCTestConfiguration((string *)current_time,this_00,&local_448);
  ptVar1 = cmCTest::GetNightlyTime(this_00,(string *)current_time,this->CTest->TomorrowTag);
  std::__cxx11::string::~string((string *)current_time);
  std::__cxx11::string::~string((string *)&local_448);
  sprintf(current_time,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,current_time,(allocator<char> *)&local_448);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::GetNightlyTime()
{
  // Get the nightly start time corresponding to the current dau.
  struct tm* t = this->CTest->GetNightlyTime(
    this->CTest->GetCTestConfiguration("NightlyStartTime"),
    this->CTest->GetTomorrowTag());
  char current_time[1024];
  sprintf(current_time, "%04d-%02d-%02d %02d:%02d:%02d", t->tm_year + 1900,
          t->tm_mon + 1, t->tm_mday, t->tm_hour, t->tm_min, t->tm_sec);
  return std::string(current_time);
}